

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O1

void __thiscall dgRedBackNode::InsertFixup(dgRedBackNode *this,dgRedBackNode **head)

{
  undefined1 *puVar1;
  dgRedBackNode *pdVar2;
  dgRedBackNode **ppdVar3;
  byte bVar4;
  dgRedBackNode *pdVar5;
  dgRedBackNode *this_00;
  
  pdVar5 = *head;
  if (pdVar5 != this) {
    this_00 = this->m_parent;
    bVar4 = this_00->field_0x20;
    if ((bVar4 & 1) != 0) {
      ppdVar3 = &this->m_parent;
      do {
        pdVar5 = this_00->m_parent->m_left;
        pdVar2 = this_00->m_parent->m_right;
        if (this_00 == pdVar5) {
          if ((pdVar2 != (dgRedBackNode *)0x0) && ((pdVar2->field_0x20 & 1) != 0)) {
            this_00->field_0x20 = bVar4 & 0xfe;
            pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
            goto LAB_0087540f;
          }
          if (this == this_00->m_right) {
            RotateLeft(this_00,head);
            this = this_00;
          }
          puVar1 = &this->m_parent->field_0x20;
          *puVar1 = *puVar1 & 0xfe;
          pdVar5 = this->m_parent->m_parent;
          if (pdVar5 != (dgRedBackNode *)0x0) {
            puVar1 = &pdVar5->field_0x20;
            *puVar1 = *puVar1 | 1;
            RotateRight(this->m_parent->m_parent,head);
          }
        }
        else {
          if (this_00 != pdVar2) {
            __assert_fail("ptr->m_parent == ptr->m_parent->m_parent->m_right",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTree.cpp"
                          ,0xa9,"void dgRedBackNode::InsertFixup(dgRedBackNode **const)");
          }
          if ((pdVar5 == (dgRedBackNode *)0x0) || ((pdVar5->field_0x20 & 1) == 0)) {
            if (this == this_00->m_left) {
              RotateRight(this_00,head);
              this = this_00;
            }
            puVar1 = &this->m_parent->field_0x20;
            *puVar1 = *puVar1 & 0xfe;
            pdVar5 = this->m_parent->m_parent;
            bVar4 = pdVar5->field_0x20;
            if ((bVar4 & 1) == 0) {
              pdVar5->field_0x20 = bVar4 | 1;
              RotateLeft(this->m_parent->m_parent,head);
            }
          }
          else {
            this_00->field_0x20 = bVar4 & 0xfe;
            pdVar5->field_0x20 = pdVar5->field_0x20 & 0xfe;
LAB_0087540f:
            puVar1 = &(*ppdVar3)->m_parent->field_0x20;
            *puVar1 = *puVar1 | 1;
            this = (*ppdVar3)->m_parent;
          }
        }
        pdVar5 = *head;
        if (this == pdVar5) break;
        ppdVar3 = &this->m_parent;
        this_00 = this->m_parent;
        bVar4 = this_00->field_0x20;
      } while ((bVar4 & 1) != 0);
    }
  }
  pdVar5->field_0x20 = pdVar5->field_0x20 & 0xfe;
  return;
}

Assistant:

void dgRedBackNode::InsertFixup(dgRedBackNode ** const head) 
{
	dgRedBackNode* ptr = this;
	// check Red-Black properties 
	while ((ptr != *head) && (ptr->m_parent->GetColor() == RED)) {
		// we have a violation 
		if (ptr->m_parent == ptr->m_parent->m_parent->m_left) {
			dgRedBackNode* const tmp = ptr->m_parent->m_parent->m_right;
			if (tmp && (tmp->GetColor() == RED)) {
				// uncle is RED 
				ptr->m_parent->SetColor(BLACK);
				tmp->SetColor(BLACK) ;
				ptr->m_parent->m_parent->SetColor(RED) ;
				ptr = ptr->m_parent->m_parent;
			} else {
				// uncle is BLACK 
				if (ptr == ptr->m_parent->m_right) {
					// make ptr a left child 
					ptr = ptr->m_parent;
					ptr->RotateLeft(head);
				}

				ptr->m_parent->SetColor(BLACK);
				if (ptr->m_parent->m_parent) {
					ptr->m_parent->m_parent->SetColor(RED);
					ptr->m_parent->m_parent->RotateRight(head);
				}
			}
		} else {
			HACD_ASSERT (ptr->m_parent == ptr->m_parent->m_parent->m_right);
			// mirror image of above code 
			dgRedBackNode* const tmp = ptr->m_parent->m_parent->m_left;
			if (tmp && (tmp->GetColor() == RED)) {
				//uncle is RED 
				ptr->m_parent->SetColor(BLACK);
				tmp->SetColor(BLACK) ;
				ptr->m_parent->m_parent->SetColor(RED) ;
				ptr = ptr->m_parent->m_parent;
			} else {
				// uncle is BLACK 
				if (ptr == ptr->m_parent->m_left) {
					ptr = ptr->m_parent;
					ptr->RotateRight(head);
				}
				ptr->m_parent->SetColor(BLACK);
				if (ptr->m_parent->m_parent->GetColor() == BLACK) {
					ptr->m_parent->m_parent->SetColor(RED) ;
				   ptr->m_parent->m_parent->RotateLeft (head); 
				}
			}
		}
	}
	(*head)->SetColor(BLACK);
}